

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MutexInit(void)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  
  if (sqlite3Config.mutex.xMutexAlloc == (_func_sqlite3_mutex_ptr_int *)0x0) {
    bVar8 = sqlite3Config.bCoreMutex == '\0';
    pcVar2 = pthreadMutexInit;
    if (bVar8) {
      pcVar2 = noopMutexInit;
    }
    pcVar3 = pthreadMutexEnd;
    if (bVar8) {
      pcVar3 = noopMutexEnd;
    }
    pcVar4 = pthreadMutexFree;
    if (bVar8) {
      pcVar4 = noopMutexFree;
    }
    pcVar7 = pthreadMutexEnter;
    if (bVar8) {
      pcVar7 = noopMutexEnter;
    }
    pcVar5 = pthreadMutexTry;
    if (bVar8) {
      pcVar5 = noopMutexTry;
    }
    pcVar6 = pthreadMutexLeave;
    if (bVar8) {
      pcVar6 = noopMutexLeave;
    }
    sqlite3Config.mutex.xMutexHeld = (_func_int_sqlite3_mutex_ptr *)0x0;
    sqlite3Config.mutex.xMutexNotheld = (_func_int_sqlite3_mutex_ptr *)0x0;
    sqlite3Config.mutex.xMutexInit = pcVar2;
    sqlite3Config.mutex.xMutexEnd = pcVar3;
    sqlite3Config.mutex.xMutexAlloc = pthreadMutexAlloc;
    sqlite3Config.mutex.xMutexFree = pcVar4;
    sqlite3Config.mutex.xMutexEnter = pcVar7;
    sqlite3Config.mutex.xMutexTry = pcVar5;
    sqlite3Config.mutex.xMutexLeave = pcVar6;
    if (bVar8) {
      sqlite3Config.mutex.xMutexAlloc = noopMutexAlloc;
    }
  }
  iVar1 = (*sqlite3Config.mutex.xMutexInit)();
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3MutexInit(void){
  int rc = SQLITE_OK;
  if( !sqlite3GlobalConfig.mutex.xMutexAlloc ){
    /* If the xMutexAlloc method has not been set, then the user did not
    ** install a mutex implementation via sqlite3_config() prior to
    ** sqlite3_initialize() being called. This block copies pointers to
    ** the default implementation into the sqlite3GlobalConfig structure.
    */
    sqlite3_mutex_methods const *pFrom;
    sqlite3_mutex_methods *pTo = &sqlite3GlobalConfig.mutex;

    if( sqlite3GlobalConfig.bCoreMutex ){
#ifdef SQLITE_ENABLE_MULTITHREADED_CHECKS
      pFrom = multiThreadedCheckMutex();
#else
      pFrom = sqlite3DefaultMutex();
#endif
    }else{
      pFrom = sqlite3NoopMutex();
    }
    pTo->xMutexInit = pFrom->xMutexInit;
    pTo->xMutexEnd = pFrom->xMutexEnd;
    pTo->xMutexFree = pFrom->xMutexFree;
    pTo->xMutexEnter = pFrom->xMutexEnter;
    pTo->xMutexTry = pFrom->xMutexTry;
    pTo->xMutexLeave = pFrom->xMutexLeave;
    pTo->xMutexHeld = pFrom->xMutexHeld;
    pTo->xMutexNotheld = pFrom->xMutexNotheld;
    sqlite3MemoryBarrier();
    pTo->xMutexAlloc = pFrom->xMutexAlloc;
  }
  assert( sqlite3GlobalConfig.mutex.xMutexInit );
  rc = sqlite3GlobalConfig.mutex.xMutexInit();

#ifdef SQLITE_DEBUG
  GLOBAL(int, mutexIsInit) = 1;
#endif

  sqlite3MemoryBarrier();
  return rc;
}